

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O2

size_t __thiscall StressTester::GetRandomSize(StressTester *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  size_t sVar6;
  
  iVar3 = PAL_rand();
  sVar6 = (long)iVar3 % 5 & 0xffffffff;
  switch(sVar6) {
  case 0:
    goto switchD_006bd992_caseD_0;
  case 1:
    iVar4 = PAL_rand();
    iVar3 = 0x10;
    break;
  case 2:
    iVar4 = PAL_rand();
    iVar3 = 0x1000;
    break;
  case 3:
    iVar4 = PAL_rand();
    iVar3 = 0x4000;
    break;
  case 4:
    iVar3 = PAL_rand();
    return (long)iVar3;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/StressTest.cpp"
                       ,0xba,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    sVar6 = 0;
    goto switchD_006bd992_caseD_0;
  }
  sVar6 = (size_t)(iVar4 % iVar3);
switchD_006bd992_caseD_0:
  return sVar6;
}

Assistant:

size_t StressTester::GetRandomSize()
{
    int i = rand() % 5;
    switch (i)
    {
    case 0: return 0;
    case 1: return rand() % 16;
    case 2: return rand() % 4096;
    case 3: return rand() % 16384;
    case 4: return rand();
    default:
        Assert(false);
        return 0;
    }
}